

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialog::done(QFontDialog *this,int result)

{
  QFont *this_00;
  QWeakPointer<QObject> *this_01;
  undefined4 uVar1;
  long lVar2;
  undefined1 *puVar3;
  char cVar4;
  bool bVar5;
  char *pcVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (result == 1) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    currentFont((QFontDialog *)&local_48);
    this_00 = (QFont *)(lVar2 + 0x3d0);
    cVar4 = QFont::operator!=((QFont *)&local_48,this_00);
    if (cVar4 != '\0') {
      currentFontChanged(this,(QFont *)&local_48);
    }
    QFont::operator=(this_00,(QFont *)&local_48);
    fontSelected(this,this_00);
  }
  else {
    QFont::QFont((QFont *)&local_48);
    puVar3 = *(undefined1 **)(lVar2 + 0x3d0);
    *(undefined1 **)(lVar2 + 0x3d0) = local_48;
    uVar1 = *(undefined4 *)(lVar2 + 0x3d8);
    *(undefined4 *)(lVar2 + 0x3d8) = puStack_40._0_4_;
    puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,uVar1);
    local_48 = puVar3;
  }
  QFont::~QFont((QFont *)&local_48);
  this_01 = (QWeakPointer<QObject> *)(lVar2 + 0x3f0);
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)this_01);
  if (bVar5) {
    if ((this_01->d == (Data *)0x0) || (*(int *)(this_01->d + 4) == 0)) {
      pQVar7 = (QObject *)0x0;
    }
    else {
      pQVar7 = *(QObject **)(lVar2 + 0x3f8);
    }
    pcVar6 = *(char **)(lVar2 + 0x408);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,"2fontSelected(QFont)",pQVar7,pcVar6);
    QWeakPointer<QObject>::assign<QObject>(this_01,(QObject *)0x0);
  }
  QByteArray::clear();
  QDialog::done(&this->super_QDialog,result);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialog::done(int result)
{
    Q_D(QFontDialog);
    if (result == Accepted) {
        // We check if this is the same font we had before, if so we emit currentFontChanged
        QFont selectedFont = currentFont();
        if (selectedFont != d->selectedFont)
            emit(currentFontChanged(selectedFont));
        d->selectedFont = selectedFont;
        emit fontSelected(d->selectedFont);
    } else
        d->selectedFont = QFont();
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, SIGNAL(fontSelected(QFont)),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
    QDialog::done(result);
}